

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaFreeValidCtxt(xmlSchemaValidCtxtPtr ctxt)

{
  xmlSchemaPSVIIDCNodePtr pxVar1;
  xmlSchemaPSVIIDCKeyPtr pxVar2;
  xmlSchemaValPtr value;
  xmlSchemaIDCAugPtr pxVar3;
  xmlSchemaNodeInfoPtr ielem;
  xmlSchemaItemListPtr pxVar4;
  xmlSchemaIDCAugPtr_conflict pxVar5;
  xmlSchemaPSVIIDCNodePtr *ppxVar6;
  xmlSchemaPSVIIDCKeyPtr *ppxVar7;
  xmlSchemaNodeInfoPtr *ppxVar8;
  long lVar9;
  
  if (ctxt == (xmlSchemaValidCtxtPtr)0x0) {
    return;
  }
  if (ctxt->value != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(ctxt->value);
  }
  if (ctxt->pctxt != (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaFreeParserCtxt(ctxt->pctxt);
  }
  ppxVar6 = ctxt->idcNodes;
  if (ppxVar6 != (xmlSchemaPSVIIDCNodePtr *)0x0) {
    if (0 < ctxt->nbIdcNodes) {
      lVar9 = 0;
      do {
        pxVar1 = ctxt->idcNodes[lVar9];
        (*xmlFree)(pxVar1->keys);
        (*xmlFree)(pxVar1);
        lVar9 = lVar9 + 1;
      } while (lVar9 < ctxt->nbIdcNodes);
      ppxVar6 = ctxt->idcNodes;
    }
    (*xmlFree)(ppxVar6);
  }
  ppxVar7 = ctxt->idcKeys;
  if (ppxVar7 != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
    if (0 < ctxt->nbIdcKeys) {
      lVar9 = 0;
      do {
        pxVar2 = ctxt->idcKeys[lVar9];
        value = pxVar2->val;
        if (value != (xmlSchemaValPtr)0x0) {
          xmlSchemaFreeValue(value);
        }
        (*xmlFree)(pxVar2);
        lVar9 = lVar9 + 1;
      } while (lVar9 < ctxt->nbIdcKeys);
      ppxVar7 = ctxt->idcKeys;
    }
    (*xmlFree)(ppxVar7);
  }
  if (ctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    xmlSchemaFreeIDCStateObjList(ctxt->xpathStates);
    ctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
  }
  if (ctxt->xpathStatePool != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    xmlSchemaFreeIDCStateObjList(ctxt->xpathStatePool);
    ctxt->xpathStatePool = (xmlSchemaIDCStateObjPtr_conflict)0x0;
  }
  pxVar5 = ctxt->aidcs;
  while (pxVar5 != (xmlSchemaIDCAugPtr_conflict)0x0) {
    pxVar3 = pxVar5->next;
    (*xmlFree)(pxVar5);
    pxVar5 = pxVar3;
  }
  if (ctxt->attrInfos != (xmlSchemaAttrInfoPtr *)0x0) {
    if (ctxt->nbAttrInfos != 0) {
      xmlSchemaClearAttrInfos(ctxt);
    }
    if (0 < ctxt->sizeAttrInfos) {
      lVar9 = 0;
      do {
        (*xmlFree)(ctxt->attrInfos[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 < ctxt->sizeAttrInfos);
    }
    (*xmlFree)(ctxt->attrInfos);
  }
  ppxVar8 = ctxt->elemInfos;
  if (ppxVar8 != (xmlSchemaNodeInfoPtr *)0x0) {
    if (0 < ctxt->sizeElemInfos) {
      lVar9 = 0;
      do {
        ppxVar8 = ctxt->elemInfos;
        ielem = ppxVar8[lVar9];
        if (ielem == (xmlSchemaNodeInfoPtr)0x0) goto LAB_0018b80c;
        xmlSchemaClearElemInfo(ctxt,ielem);
        (*xmlFree)(ielem);
        lVar9 = lVar9 + 1;
      } while (lVar9 < ctxt->sizeElemInfos);
      ppxVar8 = ctxt->elemInfos;
    }
LAB_0018b80c:
    (*xmlFree)(ppxVar8);
  }
  pxVar4 = ctxt->nodeQNames;
  if (pxVar4 != (xmlSchemaItemListPtr)0x0) {
    if (pxVar4->items != (void **)0x0) {
      (*xmlFree)(pxVar4->items);
    }
    (*xmlFree)(pxVar4);
  }
  if (ctxt->dict != (xmlDictPtr)0x0) {
    xmlDictFree(ctxt->dict);
  }
  if (ctxt->filename != (char *)0x0) {
    (*xmlFree)(ctxt->filename);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlSchemaFreeValidCtxt(xmlSchemaValidCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->value != NULL)
        xmlSchemaFreeValue(ctxt->value);
    if (ctxt->pctxt != NULL)
	xmlSchemaFreeParserCtxt(ctxt->pctxt);
    if (ctxt->idcNodes != NULL) {
	int i;
	xmlSchemaPSVIIDCNodePtr item;

	for (i = 0; i < ctxt->nbIdcNodes; i++) {
	    item = ctxt->idcNodes[i];
	    xmlFree(item->keys);
	    xmlFree(item);
	}
	xmlFree(ctxt->idcNodes);
    }
    if (ctxt->idcKeys != NULL) {
	int i;
	for (i = 0; i < ctxt->nbIdcKeys; i++)
	    xmlSchemaIDCFreeKey(ctxt->idcKeys[i]);
	xmlFree(ctxt->idcKeys);
    }

    if (ctxt->xpathStates != NULL) {
	xmlSchemaFreeIDCStateObjList(ctxt->xpathStates);
	ctxt->xpathStates = NULL;
    }
    if (ctxt->xpathStatePool != NULL) {
	xmlSchemaFreeIDCStateObjList(ctxt->xpathStatePool);
	ctxt->xpathStatePool = NULL;
    }

    /*
    * Augmented IDC information.
    */
    if (ctxt->aidcs != NULL) {
	xmlSchemaIDCAugPtr cur = ctxt->aidcs, next;
	do {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	} while (cur != NULL);
    }
    if (ctxt->attrInfos != NULL) {
	int i;
	xmlSchemaAttrInfoPtr attr;

	/* Just a paranoid call to the cleanup. */
	if (ctxt->nbAttrInfos != 0)
	    xmlSchemaClearAttrInfos(ctxt);
	for (i = 0; i < ctxt->sizeAttrInfos; i++) {
	    attr = ctxt->attrInfos[i];
	    xmlFree(attr);
	}
	xmlFree(ctxt->attrInfos);
    }
    if (ctxt->elemInfos != NULL) {
	int i;
	xmlSchemaNodeInfoPtr ei;

	for (i = 0; i < ctxt->sizeElemInfos; i++) {
	    ei = ctxt->elemInfos[i];
	    if (ei == NULL)
		break;
	    xmlSchemaClearElemInfo(ctxt, ei);
	    xmlFree(ei);
	}
	xmlFree(ctxt->elemInfos);
    }
    if (ctxt->nodeQNames != NULL)
	xmlSchemaItemListFree(ctxt->nodeQNames);
    if (ctxt->dict != NULL)
	xmlDictFree(ctxt->dict);
    if (ctxt->filename != NULL)
	xmlFree(ctxt->filename);
    xmlFree(ctxt);
}